

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2008.h
# Opt level: O0

void __thiscall RBTS<RemSP>::FirstScan(RBTS<RemSP> *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uchar *puVar8;
  uint *puVar9;
  bool bVar10;
  bool bVar11;
  uint local_70;
  uint i_1;
  uint start_1;
  uint val_1;
  uint i;
  uint start;
  uint val;
  int iStack_50;
  bool next;
  int t;
  int h_1;
  int e;
  int crb;
  int s;
  int clb;
  int c;
  uint *img_labels_row_prev;
  uint *img_labels_row;
  uchar *img_row;
  int r;
  int h;
  int w;
  RBTS<RemSP> *this_local;
  
  memset(*(void **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10,0,
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x20 -
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x18);
  RemSP::Setup();
  iVar1 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  iVar2 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  for (img_row._4_4_ = 0; img_row._4_4_ < iVar2; img_row._4_4_ = img_row._4_4_ + 1) {
    puVar8 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        img_row._4_4_);
    puVar9 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,img_row._4_4_);
    lVar3 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x48
    ;
    for (s = 0; s < iVar1; s = s + 1) {
      if (puVar8[s] != '\0') {
        bVar10 = s != 0;
        iVar5 = CircularBuffer<int>::Enqueue(&this->s_queue_,iVar1 * img_row._4_4_ + s);
        do {
          iVar4 = s;
          s = iVar4 + 1;
          bVar11 = false;
          if (s < iVar1) {
            bVar11 = puVar8[s] != '\0';
          }
        } while (bVar11);
        bVar11 = s != iVar1;
        iVar6 = CircularBuffer<int>::Enqueue(&this->e_queue_,iVar1 * img_row._4_4_ + iVar4);
        iStack_50 = CircularBuffer<int>::Front(&this->s_queue_);
        val = CircularBuffer<int>::Front(&this->e_queue_);
        while ((int)val < (int)((iVar5 - iVar1) - (uint)bVar10)) {
          iStack_50 = CircularBuffer<int>::DequeueAndFront(&this->s_queue_);
          val = CircularBuffer<int>::DequeueAndFront(&this->e_queue_);
        }
        bVar10 = false;
        s = iVar4;
        if ((int)((iVar6 - iVar1) + (uint)bVar11) < iStack_50) {
          uVar7 = RemSP::NewLabel();
          for (local_70 = iVar5 % iVar1; local_70 < ((iVar5 % iVar1 + iVar6) - iVar5) + 1U;
              local_70 = local_70 + 1) {
            puVar9[local_70] = uVar7;
          }
        }
        else {
          uVar7 = *(uint *)((long)puVar9 + ((long)(iStack_50 % iVar1) * 4 - lVar3));
          for (start_1 = iVar5 % iVar1; start_1 < ((iVar5 % iVar1 + iVar6) - iVar5) + 1U;
              start_1 = start_1 + 1) {
            puVar9[start_1] = uVar7;
          }
          while ((int)val <= iVar6 - iVar1) {
            if (bVar10) {
              RemSP::Merge(*(uint *)((long)puVar9 + ((long)(iStack_50 % iVar1) * 4 - lVar3)),uVar7);
            }
            bVar10 = true;
            iStack_50 = CircularBuffer<int>::DequeueAndFront(&this->s_queue_);
            val = CircularBuffer<int>::DequeueAndFront(&this->e_queue_);
          }
          while ((int)val < (iVar6 - iVar1) + 1) {
            bVar10 = true;
            CircularBuffer<int>::Dequeue(&this->s_queue_);
            CircularBuffer<int>::Dequeue(&this->e_queue_);
            iStack_50 = CircularBuffer<int>::Front(&this->s_queue_);
            val = CircularBuffer<int>::Front(&this->e_queue_);
          }
          if ((iStack_50 <= (int)((iVar6 - iVar1) + (uint)bVar11)) && (bVar10)) {
            RemSP::Merge(puVar9[iVar5 % iVar1],
                         *(uint *)((long)puVar9 + ((long)(iStack_50 % iVar1) * 4 - lVar3)));
          }
        }
      }
    }
  }
  return;
}

Assistant:

void FirstScan()
    {
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization
        LabelsSolver::Setup();

        // Scan Mask (Rosenfeld)
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First Scan
        int w(img_.cols); // w = N in the paper naming convention
        int h(img_.rows);

        for (int r = 0; r < h; r += 1) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            // const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int*)(((char*)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 1) {

                // Is there a new run ?
                if (img_row[c] == 0) {
                    continue;
                }

                // clb (consider left border) and crb (consider right border) are used to handle border cases ignored by
                // the original paper.

                // Yes (new run)
                // 1) We need to record the new run r(s,e)
                int clb = c != 0; // Consider left border
                int s = s_queue_.Enqueue(w * r + c++); // Current run starting index
                for (; c < w && img_row[c] > 0; c += 1) {}
                int crb = c != w; // Consider right border (derived by c - 1 != w - 1)
                int e = e_queue_.Enqueue(w * r + --c); // Current run end index

                // 2) Discard all the runs until a run r(h,t) that end after/at s - N - 1 (t in the following scheme)
                // +-+-+-+-+-+-+-+-+-+
                // | |t|>| | | | | | |
                // +-+-+-+-+-+-+-+-+-+
                // | | |s| | | |e| | |
                // +-+-+-+-+-+-+-+-+-+
                // This run always exists. It is at most the run we just found.
                int h = s_queue_.Front();
                int t = e_queue_.Front();
                while (t < s - w - clb) {
                    h = s_queue_.DequeueAndFront();
                    t = e_queue_.DequeueAndFront();
                }

                // 3A) If the run r(h,t) starts before/at e - N + 1 (h in the following scheme)
                // +-+-+-+-+-+-+-+-+-+
                // | | | | | | |<|h| |
                // +-+-+-+-+-+-+-+-+-+
                // | | |s| | | |e| | |
                // +-+-+-+-+-+-+-+-+-+
                // it connects to the current run so we update the label of the current run
                // with that of the run(h,t), taking the value from p(h) -> p(r - 1, h % w)
                // The condition (e - w + 1) % w != 0 that can be simplified as (e + 1) % w != 0 
                // is for the handling of (left) border cases that were ignored by the original 
                // paper in which the border is always considered black (background).
                bool next = false;
                if (h <= e - w + crb) {
                    unsigned val = img_labels_row_prev[h % w];
                    unsigned start = s % w;
                    for (unsigned i = start; i < start + e - s + 1; ++i) {
                        img_labels_row[i] = val;
                    }

                    // 3B) Moreover, we check for all the following run that end before/at e - N (t
                    // in the following schema), we perform a label merge of that run with the
                    // current one and we remove them from the queues (no other following run can
                    // be directly connected with these).
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | |<|t| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // The label of the current run is val. The label of the run we are analyzing 
                    // from the queue is found at p(h) -> p(r - 1, h % w).
                    while (t <= e - w) {
                        if (next) {
                            LabelsSolver::Merge(img_labels_row_prev[h % w], val);
                        }
                        next = true;
                        h = s_queue_.DequeueAndFront();
                        t = e_queue_.DequeueAndFront();
                    }

                    // 4) We check for the next run which ends after/at e - N + 1 (t in the following
                    // schema. It always exists and it is at most the current run.
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | | | |t|>|
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    while (t < e - w + 1) {
                        next = true;
                        s_queue_.Dequeue();
                        e_queue_.Dequeue();
                        h = s_queue_.Front();
                        t = e_queue_.Front();
                    }

                    // We must keep the run in the list but we may need to merge labels:
                    // If the run p(h, t) starts before/at e - N + 1 (h in the following
                    // schema) it connects to the current run so we need to merge labels.
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | | |<|h| |
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // The condition (e - w + 1) % w != 0 that can be simplified as (e + 1) % w != 0 
                    // is for the handling of (left) border cases that were ignored by the original 
                    // paper in which the border is always considered black (background).
                    if (h <= e - w + crb) {
                        if (next) {
                            LabelsSolver::Merge(img_labels_row[s % w], img_labels_row_prev[h % w]);
                        }
                    }
                }
                else {
                    // Otherwise it is a run not connected to any other, so we need a new label
                    unsigned val = LabelsSolver::NewLabel();
                    unsigned start = s % w;
                    for (unsigned i = start; i < start + e - s + 1; ++i) {
                        img_labels_row[i] = val;
                    }
                }

            }//End columns's for
        }//End rows's for
        
    }